

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O2

void __thiscall
CEmNotification::CEmNotification
          (CEmNotification *this,EC_T_DWORD dwMasterInstance,CAtEmLogging *pcLogging,
          EC_T_BOOL bRasClient)

{
  T_SLAVEJOBQUEUE *__s;
  
  this->m_dwMasterInstance = dwMasterInstance;
  this->m_pcLogging = pcLogging;
  memset(this->m_adwErrorCounter,0,0xa4);
  this->m_bRasClient = bRasClient;
  this->m_bDidIssueBlock = 0;
  __s = &this->m_oSlaveJobQueue;
  memset(__s,0,0x7670);
  (this->m_oSlaveJobQueue).pRead = __s->Jobs;
  (this->m_oSlaveJobQueue).pWrite = __s->Jobs;
  this->m_nVerbosePrinting = 0;
  this->m_bAllDevsOperational = 0;
  this->m_dwClientID = 0;
  this->m_bRasServerDisconnect = 0;
  return;
}

Assistant:

CEmNotification::CEmNotification(
    EC_T_DWORD      dwMasterInstance,   /**< [in]   Master Instance */
    CAtEmLogging*   pcLogging,          /**< [in]   Logging */
    EC_T_BOOL       bRasClient          /**< [in]   Remote API client */
                                )
{
    m_dwMasterInstance = dwMasterInstance;
    m_pcLogging = pcLogging;

    OsMemset(m_adwErrorCounter, 0, sizeof(m_adwErrorCounter));

    m_nVerbosePrinting                  = EC_FALSE;
    m_bAllDevsOperational               = EC_FALSE;

    m_bRasServerDisconnect              = EC_FALSE;
    m_bRasClient                        = bRasClient;
    m_bDidIssueBlock                    = EC_FALSE;

    OsMemset(&m_oSlaveJobQueue, 0, sizeof(T_SLAVEJOBQUEUE));

    m_oSlaveJobQueue.pRead              = &(m_oSlaveJobQueue.Jobs[0]);
    m_oSlaveJobQueue.pWrite             = &(m_oSlaveJobQueue.Jobs[0]);

    m_dwClientID                        = 0;
}